

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O3

bool S_CheckSoundLimit(sfxinfo_t *sfx,FVector3 *pos,int near_limit,float limit_range,AActor *actor,
                      int channel)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  AActor *actor_00;
  uint channum;
  FSoundChan *pFVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  FVector3 chanorigin;
  
  iVar5 = 0;
  if (0 < near_limit && Channels != (FSoundChan *)0x0) {
    iVar5 = 0;
    pFVar4 = Channels;
    do {
      if (((pFVar4->ChanFlags & 2U) == 0) && (S_sfx.Array + (pFVar4->SoundID).ID == sfx)) {
        bVar3 = pFVar4->EntChannel;
        channum = (uint)bVar3;
        if ((actor != (AActor *)0x0) &&
           ((((uint)bVar3 == channel && (channum = channel, pFVar4->SourceType == '\x01')) &&
            ((pFVar4->field_12).Actor == actor)))) {
          return false;
        }
        actor_00 = (pFVar4->field_12).Actor;
        CalcPosVel((uint)pFVar4->SourceType,actor_00,(sector_t *)actor_00,(FPolyObj *)actor_00,
                   (pFVar4->field_12).Point,channum,pFVar4->ChanFlags,&chanorigin,(FVector3 *)0x0);
        fVar6 = chanorigin.X - pos->X;
        uVar1 = pos->Y;
        uVar2 = pos->Z;
        fVar7 = chanorigin.Y - (float)uVar1;
        fVar8 = chanorigin.Z - (float)uVar2;
        iVar5 = iVar5 + (uint)(fVar8 * fVar8 + fVar6 * fVar6 + fVar7 * fVar7 <= limit_range);
      }
      pFVar4 = pFVar4->NextChan;
    } while ((pFVar4 != (FSoundChan *)0x0) && (iVar5 < near_limit));
  }
  return near_limit <= iVar5;
}

Assistant:

bool S_CheckSoundLimit(sfxinfo_t *sfx, const FVector3 &pos, int near_limit, float limit_range,
	AActor *actor, int channel)
{
	FSoundChan *chan;
	int count;
	
	for (chan = Channels, count = 0; chan != NULL && count < near_limit; chan = chan->NextChan)
	{
		if (!(chan->ChanFlags & CHAN_EVICTED) && &S_sfx[chan->SoundID] == sfx)
		{
			FVector3 chanorigin;

			if (actor != NULL && chan->EntChannel == channel &&
				chan->SourceType == SOURCE_Actor && chan->Actor == actor)
			{ // We are restarting a playing sound. Always let it play.
				return false;
			}

			CalcPosVel(chan, &chanorigin, NULL);
			if ((chanorigin - pos).LengthSquared() <= limit_range)
			{
				count++;
			}
		}
	}
	return count >= near_limit;
}